

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall DomActionGroup::~DomActionGroup(DomActionGroup *this)

{
  QList<DomAction_*> *this_00;
  QList<DomActionGroup_*> *this_01;
  QList<DomProperty_*> *this_02;
  QList<DomProperty_*> *this_03;
  
  this_00 = &this->m_action;
  qDeleteAll<QList<DomAction*>>(this_00);
  QList<DomAction_*>::clear(this_00);
  this_01 = &this->m_actionGroup;
  qDeleteAll<QList<DomActionGroup*>>(this_01);
  QList<DomActionGroup_*>::clear(this_01);
  this_02 = &this->m_property;
  qDeleteAll<QList<DomProperty*>>(this_02);
  QList<DomProperty_*>::clear(this_02);
  this_03 = &this->m_attribute;
  qDeleteAll<QList<DomProperty*>>(this_03);
  QList<DomProperty_*>::clear(this_03);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&this_03->d);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&this_02->d);
  QArrayDataPointer<DomActionGroup_*>::~QArrayDataPointer(&this_01->d);
  QArrayDataPointer<DomAction_*>::~QArrayDataPointer(&this_00->d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

DomActionGroup::~DomActionGroup()
{
    qDeleteAll(m_action);
    m_action.clear();
    qDeleteAll(m_actionGroup);
    m_actionGroup.clear();
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
}